

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::clearLPRational(SoPlexBase<double> *this)

{
  int iVar1;
  SoPlexBase<double> *in_RDI;
  
  (*(in_RDI->_rationalLP->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._vptr_ClassArray[0x1b])();
  SLUFactorRational::clear((SLUFactorRational *)in_RDI);
  DataArray<soplex::SoPlexBase<double>::RangeType>::clear(&in_RDI->_rowTypes);
  DataArray<soplex::SoPlexBase<double>::RangeType>::clear(&in_RDI->_colTypes);
  iVar1 = intParam(in_RDI,SYNCMODE);
  if (iVar1 == 1) {
    (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1b])();
    in_RDI->_hasBasis = false;
  }
  _invalidateSolution(in_RDI);
  return;
}

Assistant:

void SoPlexBase<R>::clearLPRational()
{
   assert(_rationalLP != nullptr);

   _rationalLP->clear();
   _rationalLUSolver.clear();
   _rowTypes.clear();
   _colTypes.clear();

   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
   {
      _realLP->clear();
      _hasBasis = false;
   }

   _invalidateSolution();
}